

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O2

void __thiscall deqp::gls::LongStressCaseInternal::Program::build(Program *this,TestLog *log)

{
  GLuint GVar1;
  bool compileOk;
  bool compileOk_00;
  TestError *this_00;
  _Alloc_hider in_RCX;
  size_t sVar2;
  deUint32 shaderGL;
  deUint32 shaderGL_00;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  bool linkOk;
  allocator<char> local_161;
  TestLog *local_160;
  int success;
  _Alloc_hider _Stack_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148 [4];
  string local_108;
  string local_e8;
  string local_c8;
  undefined1 local_a8 [40];
  int infoLogLen;
  
  local_160 = log;
  compileOk = compileShader(this->m_vertShaderGL);
  compileOk_00 = compileShader(this->m_fragShaderGL);
  if (compileOk && compileOk_00) {
    GVar1 = this->m_programGL;
    glwLinkProgram(GVar1);
    _success = _success & 0xffffffff00000000;
    glwGetProgramiv(GVar1,0x8b82,&success);
    linkOk = success == 1;
    if ((compileOk && compileOk_00) && linkOk) {
      this->m_isBuilt = true;
      return;
    }
    GVar1 = this->m_programGL;
    infoLogLen = 0;
    _success = (GLchar *)0x0;
    _Stack_150._M_p = (pointer)0x0;
    local_148[0]._M_allocated_capacity = 0;
    glwGetProgramiv(GVar1,0x8b84,&infoLogLen);
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)&success,(long)(infoLogLen + 1));
    in_RCX._M_p = _success;
    glwGetProgramInfoLog(GVar1,(int)_Stack_150._M_p - (int)_success,(GLsizei *)0x0,_success);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,_success,(allocator<char> *)&local_108);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)&success);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,glcts::fixed_sample_locations_values + 1,&local_161);
    linkOk = false;
  }
  tcu::LogShaderProgram::LogShaderProgram((LogShaderProgram *)local_a8,linkOk,&local_e8);
  tcu::LogShaderProgram::write
            ((LogShaderProgram *)local_a8,(int)local_160,__buf,(size_t)in_RCX._M_p);
  getShaderInfoLog_abi_cxx11_(&local_108,(gls *)(ulong)this->m_vertShaderGL,shaderGL);
  sVar2 = (size_t)compileOk;
  tcu::LogShader::LogShader
            ((LogShader *)&success,QP_SHADER_TYPE_VERTEX,&this->m_vertSource,compileOk,&local_108);
  tcu::LogShader::write((LogShader *)&success,(int)local_160,__buf_00,sVar2);
  getShaderInfoLog_abi_cxx11_(&local_c8,(gls *)(ulong)this->m_fragShaderGL,shaderGL_00);
  sVar2 = (size_t)compileOk_00;
  tcu::LogShader::LogShader
            ((LogShader *)&infoLogLen,QP_SHADER_TYPE_FRAGMENT,&this->m_fragSource,compileOk_00,
             &local_c8);
  tcu::LogShader::write((LogShader *)&infoLogLen,(int)local_160,__buf_01,sVar2);
  tcu::TestLog::endShaderProgram(local_160);
  tcu::LogShader::~LogShader((LogShader *)&infoLogLen);
  std::__cxx11::string::~string((string *)&local_c8);
  tcu::LogShader::~LogShader((LogShader *)&success);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)(local_a8 + 8));
  std::__cxx11::string::~string((string *)&local_e8);
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&success,"Program build failed",(allocator<char> *)&infoLogLen);
  tcu::TestError::TestError(this_00,(string *)&success);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void Program::build (TestLog& log)
{
	DE_ASSERT(m_hasSources);

	const bool vertCompileOk	= compileShader(m_vertShaderGL);
	const bool fragCompileOk	= compileShader(m_fragShaderGL);
	const bool attemptLink		= vertCompileOk && fragCompileOk;
	const bool linkOk			= attemptLink && linkProgram(m_programGL);

	if (!(vertCompileOk && fragCompileOk && linkOk))
	{
		log << TestLog::ShaderProgram(linkOk, attemptLink ? getProgramInfoLog(m_programGL) : string(""))
			<< TestLog::Shader(QP_SHADER_TYPE_VERTEX, m_vertSource, vertCompileOk, getShaderInfoLog(m_vertShaderGL))
			<< TestLog::Shader(QP_SHADER_TYPE_FRAGMENT, m_fragSource, fragCompileOk, getShaderInfoLog(m_fragShaderGL))
			<< TestLog::EndShaderProgram;

		throw tcu::TestError("Program build failed");
	}

	m_isBuilt = true;
}